

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BERDecode.cpp
# Opt level: O2

int __thiscall OctetType::fromBuffer(OctetType *this,uint8_t *buf,size_t max_len)

{
  uint uVar1;
  
  uVar1 = BER_CONTAINER::fromBuffer(&this->super_BER_CONTAINER,buf,max_len);
  if (-1 < (int)uVar1) {
    if ((this->super_BER_CONTAINER)._length < 0x1f5) {
      std::__cxx11::string::assign((char *)&this->_value,(ulong)(buf + uVar1));
      uVar1 = uVar1 + (this->super_BER_CONTAINER)._length;
    }
    else {
      uVar1 = 0xfffffff0;
    }
  }
  return uVar1;
}

Assistant:

int OctetType::fromBuffer(const uint8_t *buf, size_t max_len){
    int i = BER_CONTAINER::fromBuffer(buf, max_len);
    CHECK_DECODE_ERR(i);
    const uint8_t* ptr = buf + i;
    if(_length > OCTET_TYPE_MAX_LENGTH) return SNMP_BUFFER_ERROR_OCTET_TOO_BIG;

    _value.assign((char*)ptr, _length);

    return _length + i;
}